

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult ShowDatabases(ShellState *state,char **azArg,idx_t nArg)

{
  pointer pRVar1;
  undefined8 *in_RDI;
  char **unaff_retaddr;
  void *in_stack_00000008;
  sqlite3_callback in_stack_00000010;
  char *in_stack_00000018;
  sqlite3 *in_stack_00000020;
  unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_> renderer;
  char *zErrMsg;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffcc;
  ShellState *in_stack_ffffffffffffffd0;
  MetadataResult MVar2;
  
  duckdb_shell::ShellState::OpenDB(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  duckdb_shell::ShellState::GetRowRenderer(state,azArg._4_4_);
  pRVar1 = std::
           unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>::
           operator->((unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
                       *)0x1dcdeb);
  (pRVar1->super_ShellRenderer).show_header = false;
  pRVar1 = std::
           unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>::
           operator->((unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
                       *)0x1dcdf9);
  std::__cxx11::string::operator=((string *)&(pRVar1->super_ShellRenderer).col_sep,": ");
  std::unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>::get
            ((unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
              *)*in_RDI);
  duckdb_shell_sqlite3_exec
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  MVar2 = SUCCESS;
  std::unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>::
  ~unique_ptr((unique_ptr<duckdb_shell::RowRenderer,_std::default_delete<duckdb_shell::RowRenderer>_>
               *)CONCAT44(in_stack_ffffffffffffffc4,1));
  return MVar2;
}

Assistant:

MetadataResult ShowDatabases(ShellState &state, const char **azArg, idx_t nArg) {
	char *zErrMsg = 0;
	state.OpenDB(0);

	auto renderer = state.GetRowRenderer(RenderMode::LIST);
	renderer->show_header = false;
	renderer->col_sep = ": ";
	sqlite3_exec(state.db, "SELECT name, file FROM pragma_database_list", callback, renderer.get(), &zErrMsg);
	if (zErrMsg) {
		state.PrintDatabaseError(zErrMsg);
		sqlite3_free(zErrMsg);
		return MetadataResult::FAIL;
	}
	return MetadataResult::SUCCESS;
}